

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O3

Var Js::GlobalObject::EntryTelemetryLog(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  Var pvVar5;
  JavascriptString *infoStringJs;
  JavascriptBoolean *pJVar6;
  ScriptContext *pSVar7;
  undefined4 extraout_var;
  PAL_FILE *stream;
  int in_stack_00000010;
  CallInfo local_38;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar7 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_38 = callInfo;
  ThreadContext::ProbeStack(pSVar7->threadContext,0xc00,pSVar7,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x639,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_38);
  if (((ulong)callInfo_local & 0xfffffe) == 0) {
LAB_00b4d45a:
    TTDAbort_unrecoverable_error("Bad arguments!!!");
  }
  pvVar5 = Arguments::operator[]((Arguments *)&callInfo_local,1);
  bVar2 = VarIs<Js::JavascriptString>(pvVar5);
  if (!bVar2) goto LAB_00b4d45a;
  pvVar5 = Arguments::operator[]((Arguments *)&callInfo_local,1);
  infoStringJs = VarTo<Js::JavascriptString>(pvVar5);
  if ((callInfo_local._0_4_ & 0xffffff) == 3) {
    pvVar5 = Arguments::operator[]((Arguments *)&callInfo_local,2);
    bVar2 = VarIs<Js::JavascriptBoolean>(pvVar5);
    if (bVar2) {
      pvVar5 = Arguments::operator[]((Arguments *)&callInfo_local,2);
      pJVar6 = VarTo<Js::JavascriptBoolean>(pvVar5);
      bVar2 = pJVar6->value != 0;
      goto LAB_00b4d3a4;
    }
  }
  bVar2 = false;
LAB_00b4d3a4:
  pSVar7 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (pSVar7->TTDShouldPerformReplayAction == true) {
    TTD::EventLog::ReplayTelemetryLogEvent(pSVar7->threadContext->TTDLog,infoStringJs);
    pSVar7 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
  }
  if (pSVar7->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordTelemetryLogEvent(pSVar7->threadContext->TTDLog,infoStringJs,bVar2);
  }
  if (bVar2 != false) {
    iVar3 = (*(infoStringJs->super_RecyclableObject).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(infoStringJs);
    Output::Print(L"%ls\n",CONCAT44(extraout_var,iVar3));
    stream = PAL_get_stdout(0);
    PAL_fflush(stream);
  }
  return (((((((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
         super_JavascriptLibraryBase).undefinedValue.ptr;
}

Assistant:

Var GlobalObject::EntryTelemetryLog(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);

        TTDAssert(args.Info.Count >= 2 && Js::VarIs<Js::JavascriptString>(args[1]), "Bad arguments!!!");

        Js::JavascriptString* jsString = Js::VarTo<Js::JavascriptString>(args[1]);
        bool doPrint = (args.Info.Count == 3) && Js::VarIs<Js::JavascriptBoolean>(args[2]) && (Js::VarTo<Js::JavascriptBoolean>(args[2])->GetValue());

        if(function->GetScriptContext()->ShouldPerformReplayAction())
        {
            function->GetScriptContext()->GetThreadContext()->TTDLog->ReplayTelemetryLogEvent(jsString);
        }

        if(function->GetScriptContext()->ShouldPerformRecordAction())
        {
            function->GetScriptContext()->GetThreadContext()->TTDLog->RecordTelemetryLogEvent(jsString, doPrint);
        }

        if(doPrint)
        {
            //
            //TODO: the host should give us a print callback which we can use here
            //
            Output::Print(_u("%ls\n"), jsString->GetSz());
            fflush(stdout);
        }

        return function->GetScriptContext()->GetLibrary()->GetUndefined();
    }